

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.h
# Opt level: O3

void __thiscall
GlobOpt::ArraySrcOpt::ArraySrcOpt
          (ArraySrcOpt *this,GlobOpt *glob,Instr **instrRef,Value **_src1Val,Value **_src2Val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this->func = glob->func;
  this->globOpt = glob;
  this->instr = instrRef;
  this->src1Val = _src1Val;
  this->src2Val = _src2Val;
  this->baseOwnerInstr = (Instr *)0x0;
  this->baseOwnerIndir = (IndirOpnd *)0x0;
  this->baseOpnd = (RegOpnd *)0x0;
  this->indexOpnd = (Opnd *)0x0;
  this->originalIndexOpnd = (Opnd *)0x0;
  this->isProfilableLdElem = false;
  this->isProfilableStElem = false;
  this->isLoad = false;
  this->isStore = false;
  this->needsHeadSegment = false;
  this->needsHeadSegmentLength = false;
  this->needsLength = false;
  this->needsBoundChecks = false;
  this->baseValue = (Value *)0x0;
  this->baseValueInfo = (ValueInfo *)0x0;
  ValueType::ValueType(&this->baseValueType);
  ValueType::ValueType(&this->newBaseValueType);
  (this->lowerBoundCheckHoistInfo).indexConstantBounds.lowerBound = 0;
  (this->lowerBoundCheckHoistInfo).indexConstantBounds.upperBound = 0;
  (this->upperBoundCheckHoistInfo).super_ArrayLowerBoundCheckHoistInfo.indexConstantBounds.
  lowerBound = 0;
  (this->upperBoundCheckHoistInfo).super_ArrayLowerBoundCheckHoistInfo.indexConstantBounds.
  upperBound = 0;
  (this->upperBoundCheckHoistInfo).super_ArrayLowerBoundCheckHoistInfo.compatibleBoundCheckBlock =
       (BasicBlock *)0x0;
  (this->upperBoundCheckHoistInfo).super_ArrayLowerBoundCheckHoistInfo.loop = (Loop *)0x0;
  this->baseArrayValueInfo = (ArrayValueInfo *)0x0;
  this->isLikelyJsArray = false;
  this->isLikelyVirtualTypedArray = false;
  this->doArrayChecks = false;
  this->doArraySegmentHoist = false;
  this->headSegmentIsAvailable = false;
  this->doHeadSegmentLoad = false;
  this->doArraySegmentLengthHoist = false;
  this->headSegmentLengthIsAvailable = false;
  this->headSegmentLengthIsAvailable = false;
  this->doHeadSegmentLengthLoad = false;
  this->lengthIsAvailable = false;
  this->doLengthLoad = false;
  this->newHeadSegmentSym = (StackSym *)0x0;
  this->newHeadSegmentLengthSym = (StackSym *)0x0;
  *(undefined8 *)((long)&this->newHeadSegmentLengthSym + 4) = 0;
  *(undefined8 *)((long)&this->newLengthSym + 4) = 0;
  this->indexVarSym = (StackSym *)0x0;
  this->indexValue = (Value *)0x0;
  (this->indexConstantBounds).lowerBound = 0;
  (this->indexConstantBounds).upperBound = 0;
  this->headSegmentLengthValue = (Value *)0x0;
  (this->headSegmentLengthConstantBounds).lowerBound = 0;
  (this->headSegmentLengthConstantBounds).upperBound = 0;
  this->hoistChecksOutOfLoop = (Loop *)0x0;
  this->hoistHeadSegmentLoadOutOfLoop = (Loop *)0x0;
  this->hoistHeadSegmentLengthLoadOutOfLoop = (Loop *)0x0;
  this->hoistLengthLoadOutOfLoop = (Loop *)0x0;
  (this->lowerBoundCheckHoistInfo).compatibleBoundCheckBlock = (BasicBlock *)0x0;
  (this->lowerBoundCheckHoistInfo).loop = (Loop *)0x0;
  (this->upperBoundCheckHoistInfo).headSegmentLengthConstantBounds.lowerBound = 0;
  (this->upperBoundCheckHoistInfo).headSegmentLengthConstantBounds.upperBound = 0;
  this->failedToUpdateCompatibleLowerBoundCheck = false;
  this->failedToUpdateCompatibleUpperBoundCheck = false;
  this->shareableBailOutInfo = (BailOutInfo *)0x0;
  this->shareableBailOutInfoOriginalOwner = (Instr *)0x0;
  this->headSegmentLengthSym = (StackSym *)0x0;
  this->insertBeforeInstr = (Instr *)0x0;
  if (*this->instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.h"
                       ,0x11,"(instr != nullptr)","instr != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

ArraySrcOpt(GlobOpt * glob, IR::Instr ** instrRef, Value ** _src1Val, Value ** _src2Val) :
        globOpt(glob),
        func(glob->func),
        instr(*instrRef),
        src1Val(*_src1Val),
        src2Val(*_src2Val)
    {
        Assert(instr != nullptr);
    }